

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O0

void test_char<char>(void)

{
  bool bVar1;
  ostream *poVar2;
  locale l_1;
  uint i;
  int in_stack_000001dc;
  string name;
  string *in_stack_000001e8;
  locale *in_stack_000001f0;
  locale l;
  generator gen;
  string *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  generator *in_stack_fffffffffffffd28;
  string *local_2b8;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  locale local_160 [8];
  uint local_158;
  undefined1 local_153;
  allocator local_152;
  allocator local_151;
  string *local_150;
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [32];
  locale local_20 [24];
  generator local_8 [8];
  
  booster::locale::generator::generator(local_8);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"en_US.UTF-8",&local_41);
  booster::locale::generator::operator()(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"a",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"b",&local_91);
  test_one<char>(in_stack_000001f0,in_stack_000001e8,_name,in_stack_000001dc);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"a",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"a",&local_e1);
  test_one<char>(in_stack_000001f0,in_stack_000001e8,_name,in_stack_000001dc);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string(local_108);
  local_153 = 1;
  local_150 = local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"en_US.UTF-8",&local_151);
  local_150 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"en_US.ISO8859-1",&local_152);
  local_153 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  for (local_158 = 0; local_158 < 2; local_158 = local_158 + 1) {
    bVar1 = have_locale(in_stack_fffffffffffffd18);
    if (bVar1) {
      std::__cxx11::string::operator=(local_108,local_148 + (ulong)local_158 * 0x20);
      poVar2 = std::operator<<((ostream *)&std::cout,"- Testing ");
      poVar2 = std::operator<<(poVar2,local_108);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      booster::locale::generator::operator()(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"a",&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,anon_var_dwarf_26a8,&local_1a9);
      test_one<char>(in_stack_000001f0,in_stack_000001e8,_name,in_stack_000001dc);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,anon_var_dwarf_26a8,&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"d",&local_1f9);
      test_one<char>(in_stack_000001f0,in_stack_000001e8,_name,in_stack_000001dc);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::locale::~locale(local_160);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"- ");
      poVar2 = std::operator<<(poVar2,local_148 + (ulong)local_158 * 0x20);
      poVar2 = std::operator<<(poVar2," not supported, skipping");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  local_2b8 = local_108;
  do {
    local_2b8 = local_2b8 + -0x20;
    std::__cxx11::string::~string(local_2b8);
  } while (local_2b8 != local_148);
  std::__cxx11::string::~string(local_108);
  std::locale::~locale(local_20);
  booster::locale::generator::~generator(local_8);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;
    
    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"a","b",-1);
    test_one<CharType>(l,"a","a",0);

    std::string name;


    #if !defined(__APPLE__) && !defined(__FreeBSD__)
    std::string names[] = { "en_US.UTF-8", "en_US.ISO8859-1" };
    for(unsigned i=0;i<sizeof(names)/sizeof(names[0]);i++) {
        if(have_locale(names[i])) {
            name = names[i];
            std::cout << "- Testing " << name << std::endl;
            std::locale l=gen(name);
            test_one<CharType>(l,"a","ç",-1);
            test_one<CharType>(l,"ç","d",-1);
        }
        else {
            std::cout << "- " << names[i] << " not supported, skipping" << std::endl;
        }
    }
    #else
    std::cout << "- Collation is broken on this OS C standard library, skipping" << std::endl;
    #endif
}